

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::SetEnumValue
          (Reflection *this,Message *message,FieldDescriptor *field,int value)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  int number;
  Reflection *pRVar4;
  Descriptor *actual;
  Descriptor *pDVar5;
  EnumDescriptor *this_00;
  EnumValueDescriptor *pEVar6;
  UnknownFieldSet *this_01;
  EnumValueDescriptor *value_desc;
  int value_local;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  pRVar4 = Message::GetReflection(message);
  if (this != pRVar4) {
    pDVar5 = this->descriptor_;
    actual = Message::GetDescriptor(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar5,actual,field,"SetEnumValue");
  }
  pDVar5 = FieldDescriptor::containing_type(field);
  if (pDVar5 != this->descriptor_) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,field,"SetEnumValue","Field does not match message type.");
  }
  LVar2 = FieldDescriptor::label(field);
  if (LVar2 == LABEL_REPEATED) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,field,"SetEnumValue",
               "Field is repeated; the method requires a singular field.");
  }
  CVar3 = FieldDescriptor::cpp_type(field);
  if (CVar3 != CPPTYPE_ENUM) {
    anon_unknown_6::ReportReflectionUsageTypeError
              (this->descriptor_,field,"SetEnumValue",CPPTYPE_ENUM);
  }
  bVar1 = internal::CreateUnknownEnumValues(field);
  if (!bVar1) {
    this_00 = FieldDescriptor::enum_type(field);
    pEVar6 = EnumDescriptor::FindValueByNumber(this_00,value);
    if (pEVar6 == (EnumValueDescriptor *)0x0) {
      this_01 = MutableUnknownFields(this,message);
      number = FieldDescriptor::number(field);
      UnknownFieldSet::AddVarint(this_01,number,(long)value);
      return;
    }
  }
  SetEnumValueInternal(this,message,field,value);
  return;
}

Assistant:

void Reflection::SetEnumValue(Message* message, const FieldDescriptor* field,
                              int value) const {
  USAGE_MUTABLE_CHECK_ALL(SetEnumValue, SINGULAR, ENUM);
  if (!CreateUnknownEnumValues(field)) {
    // Check that the value is valid if we don't support direct storage of
    // unknown enum values.
    const EnumValueDescriptor* value_desc =
        field->enum_type()->FindValueByNumber(value);
    if (value_desc == nullptr) {
      MutableUnknownFields(message)->AddVarint(field->number(), value);
      return;
    }
  }
  SetEnumValueInternal(message, field, value);
}